

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode client_unencode_write(connectdata *conn,contenc_writer *writer,char *buf,size_t nbytes)

{
  SingleRequest *k;
  Curl_easy *data;
  size_t nbytes_local;
  char *buf_local;
  contenc_writer *writer_local;
  connectdata *conn_local;
  
  if ((nbytes == 0) || ((*(ushort *)&(conn->data->req).field_0x570 >> 3 & 1) != 0)) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    conn_local._4_4_ = Curl_client_write(conn,1,buf,nbytes);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode client_unencode_write(struct connectdata *conn,
                                      contenc_writer *writer,
                                      const char *buf, size_t nbytes)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  (void) writer;

  if(!nbytes || k->ignorebody)
    return CURLE_OK;

  return Curl_client_write(conn, CLIENTWRITE_BODY, (char *) buf, nbytes);
}